

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

bitmask<slang::ast::MethodFlags>
slang::ast::SubroutineSymbol::buildArguments
          (Scope *scope,Scope *parentScope,FunctionPortListSyntax *syntax,
          VariableLifetime defaultLifetime,
          SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *arguments)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  SyntaxNode *this;
  DeclaratorSyntax *node;
  FormalArgumentSymbol *this_00;
  SourceLocation loc;
  DeclaredType *this_01;
  ExpressionSyntax *syntax_01;
  int in_ECX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  Symbol *in_RDI;
  const_iterator cVar2;
  FormalArgumentSymbol *arg;
  DeclaratorSyntax *decl;
  FunctionPortSyntax *fps;
  bool directionSpecified;
  bitmask<slang::ast::VariableFlags> flags;
  ArgumentDirection direction;
  FunctionPortBaseSyntax *portBase;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *__range2;
  bitmask<slang::ast::VariableFlags> lastFlags;
  ArgumentDirection lastDirection;
  SyntaxNode *explicitDefault;
  DataTypeSyntax *lastType;
  Compilation *comp;
  bitmask<slang::ast::MethodFlags> resultFlags;
  SyntaxNode *in_stack_000004f8;
  Scope *in_stack_00000500;
  FormalArgumentSymbol *in_stack_fffffffffffffe98;
  FormalArgumentSymbol *in_stack_fffffffffffffea0;
  Compilation *in_stack_fffffffffffffeb0;
  FormalArgumentSymbol *in_stack_fffffffffffffeb8;
  Compilation *in_stack_fffffffffffffec0;
  Symbol *in_stack_fffffffffffffec8;
  Symbol *in_stack_fffffffffffffed0;
  not_null<slang::ast::DeclaredType_*> in_stack_fffffffffffffed8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffee0;
  Token in_stack_fffffffffffffef0;
  bitmask<slang::ast::VariableFlags> local_cc;
  bitmask<slang::ast::VariableFlags> local_ca;
  SourceRange local_c8;
  undefined4 local_b6;
  bitmask<slang::ast::VariableFlags> local_b2;
  FunctionPortSyntax *local_b0;
  byte local_a3;
  bitmask<slang::ast::VariableFlags> local_a2;
  ArgumentDirection local_a0;
  bitmask<slang::ast::MethodFlags> local_9a;
  SourceRange local_98;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  bitmask<slang::ast::VariableFlags> local_4e;
  ArgumentDirection local_4c;
  SyntaxNode *local_48;
  DataTypeSyntax *local_40;
  Compilation *local_38;
  undefined4 in_stack_ffffffffffffffd8;
  Symbol *pSVar3;
  bitmask<slang::ast::MethodFlags> local_2;
  
  local_38 = Scope::getCompilation((Scope *)in_RDI);
  local_40 = (DataTypeSyntax *)0x0;
  local_48 = (SyntaxNode *)0x0;
  local_4c = In;
  bitmask<slang::ast::VariableFlags>::bitmask(&local_4e);
  bitmask<slang::ast::MethodFlags>::bitmask(&local_2);
  slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *)0x6f3de1);
  cVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::end
                    ((SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax> *)0x6f3dfe);
  while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::iterator_base<const_slang::syntax::FunctionPortBaseSyntax_*>_>
                           ((self_type *)in_stack_fffffffffffffea0,
                            (iterator_base<const_slang::syntax::FunctionPortBaseSyntax_*> *)
                            in_stack_fffffffffffffe98), ((bVar1 ^ 0xffU) & 1) != 0) {
    this = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::iterator_base<const_slang::syntax::FunctionPortBaseSyntax_*>,_false>
            ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::iterator_base<const_slang::syntax::FunctionPortBaseSyntax_*>,_false>
                         *)0x6f3e3b)->super_SyntaxNode;
    if (this->previewNode != (SyntaxNode *)0x0) {
      Scope::addMembers(in_stack_00000500,in_stack_000004f8);
    }
    if (this->kind == DefaultFunctionPort) {
      local_4c = In;
      local_40 = (DataTypeSyntax *)0x0;
      if (local_48 == (SyntaxNode *)0x0) {
        local_48 = this;
        inheritDefaultedArgList
                  ((Scope *)cVar2.index,(Scope *)cVar2.list,this,
                   (SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        bitmask<slang::ast::MethodFlags>::bitmask(&local_9a,DefaultedSuperArg);
        bitmask<slang::ast::MethodFlags>::operator|=(&local_2,&local_9a);
      }
      else {
        in_stack_ffffffffffffff7c = 0x830006;
        pSVar3 = in_RDI;
        local_98 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffef0._0_8_);
        sourceRange.endLoc = in_RSI;
        sourceRange.startLoc = in_RDX;
        Scope::addDiag((Scope *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                       SUB84((ulong)pSVar3 >> 0x20,0),sourceRange);
        in_stack_fffffffffffffed0 = in_RDI;
        in_RDI = pSVar3;
      }
    }
    else {
      local_a0 = local_4c;
      local_a2.m_bits = local_4e.m_bits;
      local_a3 = 0;
      local_b0 = slang::syntax::SyntaxNode::as<slang::syntax::FunctionPortSyntax>(this);
      bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x6f3fa8);
      if (bVar1) {
        local_a3 = 1;
        local_a0 = SemanticFacts::getDirection((local_b0->direction).kind);
        memset(&local_b2,0,2);
        bitmask<slang::ast::VariableFlags>::bitmask(&local_b2);
        local_a2.m_bits = local_b2.m_bits;
        if (local_a0 == Ref) {
          pSVar3 = in_RDI;
          if (in_ECX == 1) {
            local_b6 = 0xbb0006;
            local_c8 = parsing::Token::range((Token *)in_stack_fffffffffffffec0);
            sourceRange_00.endLoc = in_RSI;
            sourceRange_00.startLoc = in_RDX;
            Scope::addDiag((Scope *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                           SUB84((ulong)pSVar3 >> 0x20,0),sourceRange_00);
            in_stack_fffffffffffffec8 = in_RDI;
          }
          bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x6f4087);
          if (bVar1) {
            bitmask<slang::ast::VariableFlags>::bitmask(&local_ca,Const);
            bitmask<slang::ast::VariableFlags>::operator|=(&local_a2,&local_ca);
          }
          bVar1 = parsing::Token::operator_cast_to_bool((Token *)0x6f40c5);
          in_RDI = pSVar3;
          if (bVar1) {
            bitmask<slang::ast::VariableFlags>::bitmask(&local_cc,RefStatic);
            bitmask<slang::ast::VariableFlags>::operator|=(&local_a2,&local_cc);
            in_RDI = pSVar3;
          }
        }
      }
      node = not_null<slang::syntax::DeclaratorSyntax_*>::operator*
                       ((not_null<slang::syntax::DeclaratorSyntax_*> *)0x6f410a);
      in_stack_fffffffffffffec0 = local_38;
      parsing::Token::valueText((Token *)in_stack_fffffffffffffeb0);
      parsing::Token::location(&node->name);
      this_00 = BumpAllocator::
                emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&,slang::ast::VariableLifetime&>
                          ((BumpAllocator *)in_stack_fffffffffffffed0,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffec8,(SourceLocation *)in_stack_fffffffffffffec0,
                           (ArgumentDirection *)in_stack_fffffffffffffeb8,
                           (VariableLifetime *)in_stack_fffffffffffffeb0);
      bitmask<slang::ast::VariableFlags>::operator|=
                (&(this_00->super_VariableSymbol).flags,&local_a2);
      if (local_b0->dataType == (DataTypeSyntax *)0x0) {
        if (((local_a3 & 1) == 0) && (local_40 != (DataTypeSyntax *)0x0)) {
          ValueSymbol::setDeclaredType
                    ((ValueSymbol *)in_stack_fffffffffffffea0,
                     (DataTypeSyntax *)in_stack_fffffffffffffe98);
        }
        else {
          in_stack_fffffffffffffeb0 = local_38;
          in_stack_fffffffffffffeb8 = this_00;
          in_stack_fffffffffffffef0 =
               slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffed0);
          loc = parsing::Token::location((Token *)&stack0xfffffffffffffef0);
          Compilation::createEmptyTypeSyntax((Compilation *)in_stack_fffffffffffffef0.info,loc);
          ValueSymbol::setDeclaredType
                    ((ValueSymbol *)in_stack_fffffffffffffea0,
                     (DataTypeSyntax *)in_stack_fffffffffffffe98);
          local_40 = (DataTypeSyntax *)0x0;
        }
      }
      else {
        ValueSymbol::setDeclaredType
                  ((ValueSymbol *)in_stack_fffffffffffffea0,
                   (DataTypeSyntax *)in_stack_fffffffffffffe98);
        local_40 = local_b0->dataType;
      }
      in_stack_fffffffffffffea0 = this_00;
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)in_stack_fffffffffffffeb0,
                 (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDI);
      syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffee0._M_extent_value;
      syntax_00._M_ptr = (pointer)in_stack_fffffffffffffed8.ptr;
      Symbol::setAttributes(in_stack_fffffffffffffed0,(Scope *)in_stack_fffffffffffffec8,syntax_00);
      Symbol::setSyntax((Symbol *)this_00,&node->super_SyntaxNode);
      bVar1 = std::span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>::empty
                        ((span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *)
                         0x6f42ee);
      if (!bVar1) {
        in_stack_fffffffffffffed8 =
             ValueSymbol::getDeclaredType((ValueSymbol *)in_stack_fffffffffffffe98);
        this_01 = not_null<slang::ast::DeclaredType_*>::operator->
                            ((not_null<slang::ast::DeclaredType_*> *)0x6f430e);
        DeclaredType::setDimensionSyntax(this_01,&node->dimensions);
      }
      if (node->initializer != (EqualsValueClauseSyntax *)0x0) {
        syntax_01 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                              ((not_null<slang::syntax::ExpressionSyntax_*> *)0x6f4352);
        FormalArgumentSymbol::setDefaultValueSyntax(this_00,syntax_01);
        in_stack_fffffffffffffe98 = this_00;
      }
      Scope::addMember((Scope *)in_stack_fffffffffffffea0,(Symbol *)in_stack_fffffffffffffe98);
      SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)
                 in_stack_fffffffffffffea0,(FormalArgumentSymbol **)in_stack_fffffffffffffe98);
      local_4c = local_a0;
      local_4e.m_bits = local_a2.m_bits;
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::iterator_base<const_slang::syntax::FunctionPortBaseSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::iterator_base<const_slang::syntax::FunctionPortBaseSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::FunctionPortBaseSyntax>::iterator_base<const_slang::syntax::FunctionPortBaseSyntax_*>,_false>
                *)in_stack_fffffffffffffea0);
  }
  return (bitmask<slang::ast::MethodFlags>)local_2.m_bits;
}

Assistant:

bitmask<MethodFlags> SubroutineSymbol::buildArguments(
    Scope& scope, const Scope& parentScope, const FunctionPortListSyntax& syntax,
    VariableLifetime defaultLifetime, SmallVectorBase<const FormalArgumentSymbol*>& arguments) {

    auto& comp = scope.getCompilation();
    const DataTypeSyntax* lastType = nullptr;
    const SyntaxNode* explicitDefault = nullptr;
    auto lastDirection = ArgumentDirection::In;
    bitmask<VariableFlags> lastFlags;
    bitmask<MethodFlags> resultFlags;

    for (auto portBase : syntax.ports) {
        if (portBase->previewNode)
            scope.addMembers(*portBase->previewNode);

        if (portBase->kind == SyntaxKind::DefaultFunctionPort) {
            lastDirection = ArgumentDirection::In;
            lastType = nullptr;

            if (explicitDefault) {
                // Ignore a duplicate default.
                scope.addDiag(diag::MultipleDefaultConstructorArg, portBase->sourceRange());
            }
            else {
                explicitDefault = portBase;
                inheritDefaultedArgList(scope, parentScope, *portBase, arguments);
                resultFlags |= MethodFlags::DefaultedSuperArg;
            }
            continue;
        }

        auto direction = lastDirection;
        auto flags = lastFlags;
        bool directionSpecified = false;
        auto& fps = portBase->as<FunctionPortSyntax>();
        if (fps.direction) {
            directionSpecified = true;
            direction = SemanticFacts::getDirection(fps.direction.kind);
            flags = {};

            if (direction == ArgumentDirection::Ref) {
                if (defaultLifetime == VariableLifetime::Static)
                    scope.addDiag(diag::RefArgAutomaticFunc, fps.direction.range());

                if (fps.constKeyword)
                    flags |= VariableFlags::Const;

                if (fps.staticKeyword)
                    flags |= VariableFlags::RefStatic;
            }
        }

        auto& decl = *fps.declarator;
        auto arg = comp.emplace<FormalArgumentSymbol>(decl.name.valueText(), decl.name.location(),
                                                      direction, defaultLifetime);
        arg->flags |= flags;

        // If we're given a type, use that. Otherwise, if we were given a
        // direction, default to logic. Otherwise, use the last type.
        if (fps.dataType) {
            arg->setDeclaredType(*fps.dataType);
            lastType = fps.dataType;
        }
        else if (directionSpecified || !lastType) {
            arg->setDeclaredType(comp.createEmptyTypeSyntax(decl.getFirstToken().location()));
            lastType = nullptr;
        }
        else {
            arg->setDeclaredType(*lastType);
        }

        arg->setAttributes(scope, fps.attributes);
        arg->setSyntax(decl);

        if (!decl.dimensions.empty())
            arg->getDeclaredType()->setDimensionSyntax(decl.dimensions);

        if (decl.initializer)
            arg->setDefaultValueSyntax(*decl.initializer->expr);

        scope.addMember(*arg);
        arguments.push_back(arg);

        lastDirection = direction;
        lastFlags = flags;
    }

    return resultFlags;
}